

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlReaderNewFile(xmlTextReaderPtr reader,char *filename,char *encoding,int options)

{
  int iVar1;
  xmlParserInputBufferPtr input;
  
  if (reader != (xmlTextReaderPtr)0x0 && filename != (char *)0x0) {
    input = xmlParserInputBufferCreateFilename(filename,XML_CHAR_ENCODING_NONE);
    if (input != (xmlParserInputBufferPtr)0x0) {
      iVar1 = xmlTextReaderSetup(reader,input,filename,encoding,options);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlReaderNewFile(xmlTextReaderPtr reader, const char *filename,
                 const char *encoding, int options)
{
    xmlParserInputBufferPtr input;

    if (filename == NULL)
        return (-1);
    if (reader == NULL)
        return (-1);

    input =
        xmlParserInputBufferCreateFilename(filename,
                                           XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (-1);
    return (xmlTextReaderSetup(reader, input, filename, encoding, options));
}